

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void __thiscall SQFuncState::SetStackSize(SQFuncState *this,SQInteger n)

{
  SQUnsignedInteger SVar1;
  SQLocalVarInfo lvi;
  SQLocalVarInfo local_58;
  
  for (SVar1 = (this->_vlocals)._size; n < (long)SVar1; SVar1 = SVar1 - 1) {
    SQLocalVarInfo::SQLocalVarInfo(&local_58,(this->_vlocals)._vals + ((this->_vlocals)._size - 1));
    if (local_58._name.super_SQObject._type != OT_NULL) {
      if (local_58._end_op == 0xffffffffffffffff) {
        this->_outers = this->_outers + -1;
      }
      local_58._end_op = (this->_instructions)._size - 1;
      sqvector<SQLocalVarInfo>::push_back(&this->_localvarinfos,&local_58);
    }
    sqvector<SQLocalVarInfo>::pop_back(&this->_vlocals);
    SQObjectPtr::~SQObjectPtr(&local_58._name);
  }
  return;
}

Assistant:

void SQFuncState::SetStackSize(SQInteger n)
{
    SQInteger size=_vlocals.size();
    while(size>n){
        size--;
        SQLocalVarInfo lvi = _vlocals.back();
        if(type(lvi._name)!=OT_NULL){
            if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
                _outers--;
            }
            lvi._end_op = GetCurrentPos();
            _localvarinfos.push_back(lvi);
        }
        _vlocals.pop_back();
    }
}